

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseInputCommand(WastParser *this,CommandPtr *param_1)

{
  Result RVar1;
  string text;
  Location loc;
  Var var;
  Var local_60;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ != Error) {
    GetLocation(&loc,this);
    RVar1 = Expect(this,Input);
    if (RVar1.enum_ != Error) {
      Error(this,0x1dfedd);
      Var::Var(&var);
      text._M_dataplus._M_p = (pointer)&text.field_2;
      text._M_string_length = 0;
      text.field_2._M_local_buf[0] = '\0';
      Var::Var(&local_60);
      ParseVarOpt(this,&var,&local_60);
      Var::~Var(&local_60);
      RVar1 = ParseQuotedText(this,&text,true);
      if (RVar1.enum_ != Error) {
        Expect(this,Rpar);
      }
      std::__cxx11::string::_M_dispose();
      Var::~Var(&var);
    }
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInputCommand(CommandPtr*) {
  // Parse the input command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseInputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Input);
  Error(loc, "input command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  CHECK_RESULT(ParseQuotedText(&text));
  EXPECT(Rpar);
  return Result::Error;
}